

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test_generated.h
# Opt level: O3

bool __thiscall SmallStructs::Verify(SmallStructs *this,Verifier *verifier)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,4), bVar1))
  {
    if ((4 < *(ushort *)(this + -(long)*(int *)this)) &&
       ((uVar2 = (ulong)*(ushort *)(this + (4 - (long)*(int *)this)), uVar2 != 0 &&
        (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                           (verifier,(uint8_t *)(this + *(uint *)(this + uVar2) + uVar2),2,
                            (size_t *)0x0), !bVar1)))) {
      return false;
    }
    bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6);
    if (bVar1) {
      if (((6 < *(ushort *)(this + -(long)*(int *)this)) &&
          (uVar2 = (ulong)*(ushort *)(this + (6 - (long)*(int *)this)), uVar2 != 0)) &&
         (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (verifier,(uint8_t *)(this + *(uint *)(this + uVar2) + uVar2),3,
                             (size_t *)0x0), !bVar1)) {
        return false;
      }
      verifier->depth_ = verifier->depth_ - 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset(verifier, VT_EVEN_STRUCTS) &&
           verifier.VerifyVector(even_structs()) &&
           VerifyOffset(verifier, VT_ODD_STRUCTS) &&
           verifier.VerifyVector(odd_structs()) &&
           verifier.EndTable();
  }